

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialiterable.h
# Opt level: O1

const_iterator __thiscall QSequentialIterable::constBegin(QSequentialIterable *this)

{
  void *pvVar1;
  void *extraout_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  const_iterator cVar2;
  QBaseIterator<QMetaSequence> local_38;
  QBaseIterator<QMetaSequence> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar1 = QMetaContainer::constBegin
                     ((QMetaContainer *)(in_RSI + 0x10),
                      (void *)(*(ulong *)(in_RSI + 8) & 0xfffffffffffffffe));
  local_38.m_iterator = (void *)0x0;
  *(long *)&this->super_QIterable<QMetaSequence> = in_RSI;
  (this->super_QIterable<QMetaSequence>).m_iterable.m_pointer.d = (quintptr)pvVar1;
  local_28.m_iterator = (void *)0x0;
  QBaseIterator<QMetaSequence>::clearIterator(&local_28);
  QBaseIterator<QMetaSequence>::clearIterator(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    cVar2.super_QSequentialConstIterator.super_QConstIterator<QMetaSequence>.
    super_QBaseIterator<QMetaSequence>.m_iterator = extraout_RDX;
    cVar2.super_QSequentialConstIterator.super_QConstIterator<QMetaSequence>.
    super_QBaseIterator<QMetaSequence>.m_iterable.m_pointer.d =
         (QTaggedPointer<QIterable<QMetaSequence>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_>::Tag>
          )(QTaggedPointer<QIterable<QMetaSequence>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_>::Tag>
            )this;
    return (const_iterator)
           cVar2.super_QSequentialConstIterator.super_QConstIterator<QMetaSequence>.
           super_QBaseIterator<QMetaSequence>;
  }
  __stack_chk_fail();
}

Assistant:

const_iterator constBegin() const { return const_iterator(QIterable::constBegin()); }